

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O2

unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>
wasm::Builder::makeFunction
          (Name name,HeapType type,vector<wasm::Type,_std::allocator<wasm::Type>_> *vars,
          Expression *body)

{
  undefined8 *puVar1;
  long lVar2;
  char cVar3;
  __uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true> _Var4;
  undefined8 in_R9;
  HeapType type_local;
  
  _Var4.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl = name.super_IString.str._M_len;
  cVar3 = wasm::HeapType::isSignature();
  if (cVar3 != '\0') {
    std::make_unique<wasm::Function>();
    puVar1 = *(undefined8 **)
              _Var4.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t
              .super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
              super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    *puVar1 = name.super_IString.str._M_str;
    puVar1[1] = type.id;
    lVar2 = *(long *)_Var4.
                     super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                     super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    *(vector<wasm::Type,_std::allocator<wasm::Type>_> **)(lVar2 + 0x38) = vars;
    *(undefined8 *)(lVar2 + 0x60) = in_R9;
    std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::_Vector_impl_data::_M_swap_data
              ((_Vector_impl_data *)
               (*(long *)_Var4.
                         super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                         .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x48),
               (_Vector_impl_data *)body);
    return (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
           (tuple<wasm::Function_*,_std::default_delete<wasm::Function>_>)
           _Var4.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
           super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
  }
  __assert_fail("type.isSignature()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-builder.h"
                ,0x31,
                "static std::unique_ptr<Function> wasm::Builder::makeFunction(Name, HeapType, std::vector<Type> &&, Expression *)"
               );
}

Assistant:

static std::unique_ptr<Function> makeFunction(Name name,
                                                HeapType type,
                                                std::vector<Type>&& vars,
                                                Expression* body = nullptr) {
    assert(type.isSignature());
    auto func = std::make_unique<Function>();
    func->name = name;
    func->type = type;
    func->body = body;
    func->vars.swap(vars);
    return func;
  }